

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall ocl::OpenCLEngine::OpenCLEngine(OpenCLEngine *this)

{
  OpenCLEngine *this_local;
  
  DeviceInfo::DeviceInfo(&this->device_info_);
  std::
  map<int,__cl_program_*,_std::less<int>,_std::allocator<std::pair<const_int,__cl_program_*>_>_>::
  map(&this->programs_);
  std::
  map<int,_ocl::OpenCLKernel_*,_std::less<int>,_std::allocator<std::pair<const_int,_ocl::OpenCLKernel_*>_>_>
  ::map(&this->kernels_);
  this->platform_id_ = (cl_platform_id)0x0;
  this->device_id_ = (cl_device_id)0x0;
  this->context_ = (cl_context)0x0;
  this->command_queue_ = (cl_command_queue)0x0;
  this->total_mem_size_ = 0;
  return;
}

Assistant:

OpenCLEngine::OpenCLEngine()
{
	platform_id_				= 0;
	device_id_					= 0;
	context_					= 0;
	command_queue_				= 0;
	total_mem_size_				= 0;
}